

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.hpp
# Opt level: O3

bool __thiscall Kernel::Clause::isGround(Clause *this)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Literal *pLVar5;
  ulong uVar6;
  
  uVar1 = (uint)*(undefined8 *)&this->field_0x38 & 0xfffff;
  uVar6 = 0;
  do {
    uVar2 = (ulong)uVar1;
    if (uVar6 == uVar1) break;
    pLVar5 = this->_literals[uVar6];
    iVar3 = 0;
    if (*(int *)&(pLVar5->super_Term).field_0xc < 0) {
      iVar3 = 0;
      do {
        pLVar5 = *(Literal **)&(pLVar5->super_Term).field_9._vars;
        if (((ulong)pLVar5 & 1) != 0) {
          uVar4 = 3;
          goto LAB_00516bab;
        }
        iVar3 = iVar3 + 2;
      } while (*(int *)&(pLVar5->super_Term).field_0xc < 0);
    }
    uVar4 = (pLVar5->super_Term).field_9._vars;
LAB_00516bab:
    uVar2 = uVar6;
    uVar6 = uVar6 + 1;
  } while (iVar3 + uVar4 == 0);
  return uVar1 <= (uint)uVar2;
}

Assistant:

unsigned size() const { return _length; }